

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FRINTX(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    s_local._7_1_ = do_zpz_ptr(s,a->rd,a->rn,a->pg,a->esz == 1,trans_FRINTX::fns[a->esz + -1]);
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_FRINTX(DisasContext *s, arg_rpr_esz *a)
{
    static gen_helper_gvec_3_ptr * const fns[3] = {
        gen_helper_sve_frintx_h,
        gen_helper_sve_frintx_s,
        gen_helper_sve_frintx_d
    };
    if (a->esz == 0) {
        return false;
    }
    return do_zpz_ptr(s, a->rd, a->rn, a->pg, a->esz == MO_16, fns[a->esz - 1]);
}